

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::ContextShaderProgram::shadeFragments
          (ContextShaderProgram *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  int local_48;
  int local_44;
  int fragNdx;
  int packetNdx;
  Vec4 color;
  size_t varyingLocColor;
  FragmentShadingContext *context_local;
  int numPackets_local;
  FragmentPacket *packets_local;
  ContextShaderProgram *this_local;
  
  color.m_data[2] = 0.0;
  color.m_data[3] = 0.0;
  rr::readTriangleVarying<float>((rr *)&fragNdx,packets,context,0,0);
  for (local_44 = 0; local_44 < numPackets; local_44 = local_44 + 1) {
    for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
      rr::writeFragmentOutput<tcu::Vector<float,4>>
                (context,local_44,local_48,0,(Vector<float,_4> *)&fragNdx);
    }
  }
  return;
}

Assistant:

void ContextShaderProgram::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const size_t varyingLocColor = 0;

	// Triangles are flashaded
	tcu::Vec4 color = rr::readTriangleVarying<float>(packets[0], context, varyingLocColor, 0);

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
}